

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r6p_1lin.cpp
# Opt level: O3

bool testR6PSingleLin(void)

{
  double dVar1;
  Index IVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  Index size;
  Index index;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  byte bVar9;
  Index index_1;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  Index col;
  Index inner_1;
  RSSinglelinCameraPose *model;
  double *pdVar13;
  long lVar14;
  MatrixXd X;
  RSSinglelinCameraPoseVector results;
  Vector2d temp;
  Vector2d temp_1;
  MatrixXd u;
  DenseStorage<double,__1,__1,__1,_0> local_3d8;
  Vector3d local_3b8;
  Vector3d local_398;
  Vector2d local_378;
  DenseStorage<double,__1,__1,__1,_0> local_368;
  double local_350;
  Vector3d local_348;
  Vector3d VStack_330;
  Vector3d local_318;
  Vector3d VStack_300;
  double local_2e8;
  double dStack_2e0;
  RSSinglelinCameraPose local_2d8;
  RSSinglelinCameraPose local_268;
  RSSinglelinCameraPose local_1f8;
  RSSinglelinCameraPose local_188;
  RSSinglelinCameraPose local_118;
  RSSinglelinCameraPose local_a8;
  
  srand(2);
  local_3d8.m_data = (double *)0x0;
  local_3d8.m_rows = 0;
  local_3d8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_3d8,0x12,3,6);
  local_368.m_data = (double *)0x0;
  local_368.m_rows = 0;
  local_368.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_368,0xc,2,6);
  VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  if ((local_3d8.m_rows == 3) && (lVar8 = 0x12, local_3d8.m_cols == 6)) {
LAB_0010a494:
    pdVar13 = local_3d8.m_data;
    lVar14 = 0;
    do {
      iVar5 = rand();
      pdVar13[lVar14] = ((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0;
      lVar14 = lVar14 + 1;
    } while (lVar8 != lVar14);
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_3d8,0x12,3,6);
    lVar8 = local_3d8.m_cols * local_3d8.m_rows;
    if (0 < lVar8) goto LAB_0010a494;
  }
  local_2e8 = 1.0;
  dStack_2e0 = 0.0;
  lVar8 = 0;
  lVar14 = 0;
  do {
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_3d8.m_data[local_3d8.m_rows * lVar14];
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (local_3d8.m_data + local_3d8.m_rows * lVar14)[1];
    local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_3d8.m_data[local_3d8.m_rows * lVar14 + 2];
    iVar5 = rs1LinProjection(&local_3b8,(Vector2d *)&local_398,&local_348,&VStack_330,&local_318,
                             &VStack_300,local_2e8,dStack_2e0,0.0,0);
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "R6P singlelin, RS in x direction, test failed due to projection function\n",0x49);
      bVar7 = false;
      goto LAB_0010af9c;
    }
    uVar6 = local_368.m_rows;
    if ((((ulong)(local_368.m_data + local_368.m_rows * lVar14) & 7) == 0) &&
       (uVar6 = (ulong)((uint)((ulong)(local_368.m_data + local_368.m_rows * lVar14) >> 3) & 1),
       local_368.m_rows <= (long)uVar6)) {
      uVar6 = local_368.m_rows;
    }
    if (0 < (long)uVar6) {
      uVar11 = 0;
      do {
        *(double *)((long)local_368.m_data + uVar11 * 8 + local_368.m_rows * lVar8) =
             local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
    lVar12 = local_368.m_rows - uVar6;
    uVar11 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar6;
    if (1 < lVar12) {
      do {
        dVar1 = local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[uVar6 + 1];
        pdVar13 = (double *)((long)local_368.m_data + uVar6 * 8 + local_368.m_rows * lVar8);
        *pdVar13 = local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar6];
        pdVar13[1] = dVar1;
        uVar6 = uVar6 + 2;
      } while ((long)uVar6 < (long)uVar11);
    }
    if ((long)uVar11 < local_368.m_rows) {
      do {
        *(double *)((long)local_368.m_data + uVar11 * 8 + local_368.m_rows * lVar8) =
             local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (local_368.m_rows != uVar11);
    }
    lVar14 = lVar14 + 1;
    lVar8 = lVar8 + 8;
  } while (lVar14 != 6);
  local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  iVar5 = R6P1Lin((MatrixXd *)&local_3d8,(MatrixXd *)&local_368,0,0.0,2,
                  (RSSinglelinCameraPoseVector *)&local_3b8);
  dVar1 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  if (iVar5 == 2) {
    lVar8 = 0x57;
    pcVar10 = 
    "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 did not converge\n";
LAB_0010a6a3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
LAB_0010a7e8:
    bVar7 = false;
  }
  else {
    if (iVar5 == 1) {
      lVar8 = 0x5b;
      pcVar10 = 
      "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned no solution\n"
      ;
      goto LAB_0010a6a3;
    }
    if (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] ==
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1]) {
LAB_0010a7d0:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned bad pose\n"
                 ,0x58);
      goto LAB_0010a7e8;
    }
    pdVar13 = (double *)
              local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
    bVar3 = 0;
    do {
      bVar9 = bVar3;
      local_a8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
      local_a8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
      local_a8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      local_a8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[2];
      local_a8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[0];
      local_a8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[1];
      local_a8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
      local_a8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
      local_a8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      local_a8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[2];
      local_a8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[0];
      local_a8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[1];
      local_a8.f = local_2e8;
      local_a8.rd = dStack_2e0;
      local_118.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[2];
      local_118.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = *pdVar13;
      local_118.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[1];
      local_118.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[5];
      local_118.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = pdVar13[3];
      local_118.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[4];
      local_118.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[8];
      local_118.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = pdVar13[6];
      local_118.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[7];
      local_118.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[0xb];
      local_118.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = pdVar13[9];
      local_118.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[10];
      local_118.f = pdVar13[0xc];
      local_118.rd = pdVar13[0xd];
      bVar4 = isPoseApproxEqual<RSSinglelinCameraPose>(&local_a8,&local_118);
      pdVar13 = pdVar13 + 0xe;
      bVar3 = bVar9 | bVar4;
    } while (pdVar13 != (double *)dVar1);
    bVar7 = true;
    if (bVar9 == 0 && !bVar4) goto LAB_0010a7d0;
  }
  local_2e8 = 1.0;
  lVar8 = 3;
  do {
    iVar5 = rand();
    local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [lVar8] = ((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  lVar8 = 0;
  do {
    iVar5 = rand();
    local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [lVar8] = (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0) / 10.0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 6;
  local_350 = local_2e8;
  do {
    iVar5 = rand();
    local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [lVar8] = ((((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0) / local_350) / 10.0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  lVar8 = 9;
  local_350 = local_2e8;
  do {
    iVar5 = rand();
    IVar2 = local_3d8.m_rows;
    local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [lVar8] = ((((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0) / local_350) / 10.0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xc);
  dStack_2e0 = 0.0;
  local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       5.0;
  lVar8 = 0;
  pdVar13 = local_3d8.m_data;
  do {
    lVar14 = 0;
    do {
      iVar5 = rand();
      pdVar13[lVar14] =
           ((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0 +
           local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar8 = lVar8 + 1;
    pdVar13 = pdVar13 + IVar2;
  } while (lVar8 != 6);
  lVar8 = 0;
  lVar14 = 0;
  do {
    local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_3d8.m_data[local_3d8.m_rows * lVar14];
    local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (local_3d8.m_data + local_3d8.m_rows * lVar14)[1];
    local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_3d8.m_data[local_3d8.m_rows * lVar14 + 2];
    iVar5 = rs1LinProjection(&local_398,&local_378,&local_348,&VStack_330,&local_318,&VStack_300,
                             local_2e8,dStack_2e0,0.0,0);
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "R6P singlelin, RS in x direction, test failed due to projection function\n",0x49);
      goto LAB_0010af8b;
    }
    uVar6 = local_368.m_rows;
    if ((((ulong)(local_368.m_data + local_368.m_rows * lVar14) & 7) == 0) &&
       (uVar6 = (ulong)((uint)((ulong)(local_368.m_data + local_368.m_rows * lVar14) >> 3) & 1),
       local_368.m_rows <= (long)uVar6)) {
      uVar6 = local_368.m_rows;
    }
    if (0 < (long)uVar6) {
      uVar11 = 0;
      do {
        *(double *)((long)local_368.m_data + uVar11 * 8 + local_368.m_rows * lVar8) =
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
    lVar12 = local_368.m_rows - uVar6;
    uVar11 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar6;
    if (1 < lVar12) {
      do {
        dVar1 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                m_data.array[uVar6 + 1];
        pdVar13 = (double *)((long)local_368.m_data + uVar6 * 8 + local_368.m_rows * lVar8);
        *pdVar13 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                   m_data.array[uVar6];
        pdVar13[1] = dVar1;
        uVar6 = uVar6 + 2;
      } while ((long)uVar6 < (long)uVar11);
    }
    if ((long)uVar11 < local_368.m_rows) {
      do {
        *(double *)((long)local_368.m_data + uVar11 * 8 + local_368.m_rows * lVar8) =
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (local_368.m_rows != uVar11);
    }
    lVar14 = lVar14 + 1;
    lVar8 = lVar8 + 8;
  } while (lVar14 != 6);
  iVar5 = R6P1Lin((MatrixXd *)&local_3d8,(MatrixXd *)&local_368,0,0.0,2,
                  (RSSinglelinCameraPoseVector *)&local_3b8);
  dVar1 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  if (iVar5 == 1) {
    lVar8 = 0x49;
    pcVar10 = "R6P singlelin, RS in x direction, for random values returned no solution\n";
LAB_0010ab61:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
LAB_0010ac9a:
    bVar7 = false;
  }
  else {
    if (iVar5 == 2) {
      lVar8 = 0x45;
      pcVar10 = "R6P singlelin, RS in x direction, for random values did not converge\n";
      goto LAB_0010ab61;
    }
    if (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] ==
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1]) {
LAB_0010ac82:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "R6P singlelin, RS in x direction, for random values returned bad pose\n",0x46);
      goto LAB_0010ac9a;
    }
    pdVar13 = (double *)
              local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
    bVar3 = 0;
    do {
      bVar9 = bVar3;
      local_188.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_188.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_188.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_188.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_188.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_188.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_188.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_188.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_188.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_188.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      local_188.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0];
      local_188.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1];
      local_188.f = local_2e8;
      local_188.rd = dStack_2e0;
      local_1f8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[2];
      local_1f8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = *pdVar13;
      local_1f8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[1];
      local_1f8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[5];
      local_1f8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = pdVar13[3];
      local_1f8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[4];
      local_1f8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[8];
      local_1f8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = pdVar13[6];
      local_1f8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[7];
      local_1f8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = pdVar13[0xb];
      local_1f8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = pdVar13[9];
      local_1f8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = pdVar13[10];
      local_1f8.f = pdVar13[0xc];
      local_1f8.rd = pdVar13[0xd];
      bVar4 = isPoseApproxEqual<RSSinglelinCameraPose>(&local_188,&local_1f8);
      pdVar13 = pdVar13 + 0xe;
      bVar3 = bVar9 | bVar4;
    } while (pdVar13 != (double *)dVar1);
    if (bVar9 == 0 && !bVar4) goto LAB_0010ac82;
  }
  lVar8 = 0;
  lVar14 = 0;
  do {
    local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_3d8.m_data[local_3d8.m_rows * lVar14];
    local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (local_3d8.m_data + local_3d8.m_rows * lVar14)[1];
    local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_3d8.m_data[local_3d8.m_rows * lVar14 + 2];
    iVar5 = rs1LinProjection(&local_398,&local_378,&local_348,&VStack_330,&local_318,&VStack_300,
                             local_2e8,dStack_2e0,0.0,1);
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "R6P singlelin, RS in y direction, test failed due to projection function\n",0x49);
      goto LAB_0010af8b;
    }
    uVar6 = local_368.m_rows;
    if ((((ulong)(local_368.m_data + local_368.m_rows * lVar14) & 7) == 0) &&
       (uVar6 = (ulong)((uint)((ulong)(local_368.m_data + local_368.m_rows * lVar14) >> 3) & 1),
       local_368.m_rows <= (long)uVar6)) {
      uVar6 = local_368.m_rows;
    }
    if (0 < (long)uVar6) {
      uVar11 = 0;
      do {
        *(double *)((long)local_368.m_data + uVar11 * 8 + local_368.m_rows * lVar8) =
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
    lVar12 = local_368.m_rows - uVar6;
    uVar11 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar6;
    if (1 < lVar12) {
      do {
        dVar1 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                m_data.array[uVar6 + 1];
        pdVar13 = (double *)((long)local_368.m_data + uVar6 * 8 + local_368.m_rows * lVar8);
        *pdVar13 = local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                   m_data.array[uVar6];
        pdVar13[1] = dVar1;
        uVar6 = uVar6 + 2;
      } while ((long)uVar6 < (long)uVar11);
    }
    if ((long)uVar11 < local_368.m_rows) {
      do {
        *(double *)((long)local_368.m_data + uVar11 * 8 + local_368.m_rows * lVar8) =
             local_378.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (local_368.m_rows != uVar11);
    }
    lVar14 = lVar14 + 1;
    lVar8 = lVar8 + 8;
  } while (lVar14 != 6);
  iVar5 = R6P1Lin((MatrixXd *)&local_3d8,(MatrixXd *)&local_368,1,0.0,2,
                  (RSSinglelinCameraPoseVector *)&local_3b8);
  dVar1 = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  if (iVar5 == 1) {
    lVar8 = 0x49;
    pcVar10 = "R6P singlelin, RS in y direction, for random values returned no solution\n";
LAB_0010ae4e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  }
  else {
    if (iVar5 == 2) {
      lVar8 = 0x45;
      pcVar10 = "R6P singlelin, RS in y direction, for random values did not converge\n";
      goto LAB_0010ae4e;
    }
    if (local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] !=
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1]) {
      pdVar13 = (double *)
                local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
      bVar3 = 0;
      do {
        bVar9 = bVar3;
        local_268.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
        local_268.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
        local_268.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
        local_268.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[2];
        local_268.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[0];
        local_268.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = VStack_330.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[1];
        local_268.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
        local_268.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
        local_268.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
        local_268.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[2];
        local_268.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[0];
        local_268.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = VStack_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[1];
        local_268.f = local_2e8;
        local_268.rd = dStack_2e0;
        local_2d8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar13[2];
        local_2d8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = *pdVar13;
        local_2d8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar13[1];
        local_2d8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar13[5];
        local_2d8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = pdVar13[3];
        local_2d8.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar13[4];
        local_2d8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar13[8];
        local_2d8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = pdVar13[6];
        local_2d8.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar13[7];
        local_2d8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar13[0xb];
        local_2d8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = pdVar13[9];
        local_2d8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar13[10];
        local_2d8.f = pdVar13[0xc];
        local_2d8.rd = pdVar13[0xd];
        bVar4 = isPoseApproxEqual<RSSinglelinCameraPose>(&local_268,&local_2d8);
        pdVar13 = pdVar13 + 0xe;
        bVar3 = bVar9 | bVar4;
      } while (pdVar13 != (double *)dVar1);
      if (bVar9 != 0 || bVar4) goto LAB_0010af8d;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "R6P singlelin, RS in y direction, for random values returned bad pose\n",0x46);
  }
LAB_0010af8b:
  bVar7 = false;
LAB_0010af8d:
  if ((double *)
      local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] != (double *)0x0) {
    operator_delete((void *)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array[0]);
  }
LAB_0010af9c:
  free(local_368.m_data);
  free(local_3d8.m_data);
  return bVar7;
}

Assistant:

bool testR6PSingleLin(){
    std::srand(2);
    Eigen::MatrixXd X(3,6);
    Eigen::MatrixXd u(2,6);
    
    double r0 = 0;
    int direction = 0;
    int n_points = 6;
    int maxpow = 2;
    
    bool passed = true;



    // // first test all zeros and f = 1 and X random
    RSSinglelinCameraPose gt;
    gt.v << 0,0,0;
    gt.w << 0,0,0;
    gt.C << 0,0,0;
    gt.t << 0,0,0;
    X = Eigen::Matrix<double,3,6>::Random();
    gt.f = 1;
    gt.rd = 0;


    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in x direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }

    RSSinglelinCameraPoseVector results;

    int res = R6P1Lin(X, u, direction, r0, maxpow, &results);
    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in x direction, for random X all params 0 and f = 1 returned bad pose\n";
            passed = false;
        }
    }

    // now test with random reasonable values

    gt.f = 1;
    gt.C << Eigen::Vector3d::Random();
    gt.v << Eigen::Vector3d::Random()/10;
    gt.w << Eigen::Vector3d::Random()/gt.f/10;
    gt.t << Eigen::Vector3d::Random()/gt.f/10;
    gt.rd = 0;
    X << Eigen::MatrixXd::Random(3,6) + Eigen::Vector3d(0,0,5).replicate(1,6);
    
    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in x direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }


    res = R6P1Lin(X, u, direction, r0, maxpow, &results);

    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in x direction, for random values returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in x direction, for random values did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in x direction, for random values returned bad pose\n";
            passed = false;
        }
    }

    
    

    // Now test with the other RS direction
    direction = 1;
    // create exact 2D projections
    for (int i = 0; i < n_points; i++)
    {
        Eigen::Vector2d temp;
        if(rs1LinProjection(X.col(i), temp, gt.v, gt.C, gt.w, gt.t,  gt.f,  gt.rd,  r0,  direction)){
            std::cout << "R6P singlelin, RS in y direction, test failed due to projection function\n";
            return 0;
        }
        u.col(i) = temp;
    }

    res = R6P1Lin(X, u, direction, r0, maxpow, &results);

    if(res == ERR_NO_SOLUTION){
        std::cout << "R6P singlelin, RS in y direction, for random values returned no solution\n";
        passed = false;
    }else if(res == WARN_NO_CONVERGENCE){
        std::cout << "R6P singlelin, RS in y direction, for random values did not converge\n";
        passed = false;
    }else{
        bool ident = false;
        for (auto const& model: results)
        {
            if(isPoseApproxEqual(gt,model)){
                ident = true;
            }
        }
        if(!ident){
            std::cout << "R6P singlelin, RS in y direction, for random values returned bad pose\n";
            passed = false;
        }
    }

    return passed;

}